

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O2

void on_link_state_changed(void *context,LINK_STATE new_link_state,LINK_STATE previous_link_state)

{
  LINK_STATE LStack_20;
  
  if (new_link_state == LINK_STATE_DETACHED) {
    if (1 < *(int *)((long)context + 0x18) - 3U) {
      if (*(int *)((long)context + 0x18) == 1) {
        return;
      }
      LStack_20 = LINK_STATE_ERROR;
      new_link_state = LStack_20;
      goto LAB_00152e9d;
    }
  }
  else {
    if (new_link_state != LINK_STATE_ERROR) {
      if ((new_link_state != LINK_STATE_ATTACHED) || (*(int *)((long)context + 0x18) != 2)) {
        return;
      }
      LStack_20 = LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED;
      new_link_state = LStack_20;
      goto LAB_00152e9d;
    }
    if (*(int *)((long)context + 0x18) == 5) {
      return;
    }
  }
  indicate_all_messages_as_error((MESSAGE_SENDER_INSTANCE *)context);
LAB_00152e9d:
  set_message_sender_state((MESSAGE_SENDER_INSTANCE *)context,new_link_state);
  return;
}

Assistant:

static void on_link_state_changed(void* context, LINK_STATE new_link_state, LINK_STATE previous_link_state)
{
    MESSAGE_RECEIVER_INSTANCE* message_receiver = (MESSAGE_RECEIVER_INSTANCE*)context;
    (void)previous_link_state;

    switch (new_link_state)
    {
    default:
        break;

    case LINK_STATE_ATTACHED:
        if (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPENING)
        {
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_OPEN);
        }
        break;
    case LINK_STATE_DETACHED:
        if ((message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPEN) ||
            (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_CLOSING))
        {
            /* User initiated transition, we should be good */
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_IDLE);
        }
        else if (message_receiver->message_receiver_state != MESSAGE_RECEIVER_STATE_IDLE)
        {
            /* Any other transition must be an error */
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
        }
        break;
    case LINK_STATE_ERROR:
        if (message_receiver->message_receiver_state != MESSAGE_RECEIVER_STATE_ERROR)
        {
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
        }
        break;
    }
}